

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.h
# Opt level: O1

void __thiscall Memory::ReferencedArenaAdapter::ReleaseStrongReference(ReferencedArenaAdapter *this)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  uint32 uVar1;
  
  CCLock::Enter(&(this->adapterLock).super_CCLock);
  uVar1 = this->strongRefCount - 1;
  this->strongRefCount = uVar1;
  if ((this->deleteFlag == true) &&
     (this_00 = &this->arena->
                 super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
     uVar1 == 0 &&
     this_00 != (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)0x0)) {
    ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase(this_00)
    ;
    HeapAllocator::Free(&HeapAllocator::Instance,this_00,0x80);
    this->arena = (ArenaAllocator *)0x0;
  }
  CCLock::Leave(&(this->adapterLock).super_CCLock);
  return;
}

Assistant:

void ReleaseStrongReference()
    {
        adapterLock.Enter();
        strongRefCount--;

        if (deleteFlag && this->arena && 0 == strongRefCount)
        {
            // All strong references are gone, delete the arena
            HeapDelete(this->arena);
            this->arena = NULL;
        }

        adapterLock.Leave();
    }